

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode-xid.hh
# Opt level: O0

bool unicode_xid::is_xid_start(uint32_t codepoint)

{
  uint32_t uVar1;
  uint32_t uVar2;
  bool bVar3;
  pointer ppVar4;
  __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_38;
  uint32_t local_2c;
  pair<int,_int> *local_28;
  pair<int,_int> *local_20;
  __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_18;
  __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  it;
  uint32_t codepoint_local;
  
  if (codepoint < 0x110000) {
    it._M_current._0_4_ = codepoint;
    local_20 = (pair<int,_int> *)
               std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                         ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          detail::kXID_StartTable);
    local_28 = (pair<int,_int> *)
               std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                         ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          detail::kXID_StartTable);
    local_2c = (uint32_t)it._M_current;
    local_18 = std::
               lower_bound<__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,int,unicode_xid::is_xid_start(unsigned_int)::_lambda(std::pair<int,int>const&,int)_1_>
                         (local_20,local_28,&local_2c);
    local_38._M_current =
         (pair<int,_int> *)
         std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                   ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                    detail::kXID_StartTable);
    bVar3 = __gnu_cxx::operator!=(&local_18,&local_38);
    uVar1 = (uint32_t)it._M_current;
    if (((bVar3) &&
        (ppVar4 = __gnu_cxx::
                  __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                  ::operator->(&local_18), uVar2 = (uint32_t)it._M_current,
        ppVar4->first <= (int)uVar1)) &&
       (ppVar4 = __gnu_cxx::
                 __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                 ::operator->(&local_18), (int)uVar2 <= ppVar4->second)) {
      it._M_current._7_1_ = true;
    }
    else {
      it._M_current._7_1_ = false;
    }
  }
  else {
    it._M_current._7_1_ = false;
  }
  return it._M_current._7_1_;
}

Assistant:

inline bool is_xid_start(uint32_t codepoint) {
  if (codepoint > kMaxCodepoint) {
    return false;
  }

  // first a range(range_begin <= codepoint <= range_end) by comparing the second key(range end).
  auto it = std::lower_bound(detail::kXID_StartTable.begin(), detail::kXID_StartTable.end(), int(codepoint), [](const std::pair<int, int> &a, const int b) {
    return a.second < b;
  });

  if (it != detail::kXID_StartTable.end()) {
    if ((int(codepoint) >= it->first) && (int(codepoint) <= it->second)) { // range end is inclusive.
      return true;
    }
  }

  return false;
}